

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cc
# Opt level: O2

int open_socket(char *host)

{
  ushort uVar1;
  int iVar3;
  char *pcVar4;
  hostent *phVar5;
  ssize_t sVar6;
  ostream *poVar7;
  ostream *poVar8;
  int *piVar9;
  char *pcVar10;
  vw_exception *pvVar11;
  string local_320;
  string local_300;
  string local_2e0;
  sockaddr_in far_end;
  char id;
  ostream local_2a0;
  char __errmsg [256];
  int iVar2;
  
  pcVar4 = index(host,0x3a);
  if (pcVar4 == (char *)0x0) {
    phVar5 = gethostbyname(host);
    uVar1 = 0x67ae;
  }
  else {
    iVar2 = atoi(pcVar4 + 1);
    uVar1 = (ushort)iVar2;
    _id = &local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&id,host,pcVar4);
    phVar5 = gethostbyname((char *)_id);
    std::__cxx11::string::~string((string *)&id);
  }
  if (phVar5 == (hostent *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&id);
    poVar7 = &local_2a0;
    poVar8 = std::operator<<(poVar7,"gethostbyname(");
    poVar8 = std::operator<<(poVar8,host);
    std::operator<<(poVar8,")");
    piVar9 = __errno_location();
    pcVar4 = __errmsg;
    pcVar10 = strerror_r(*piVar9,pcVar4,0x100);
    if (pcVar10 == (char *)0x0) {
      poVar7 = std::operator<<(poVar7,"errno = ");
    }
    else {
      pcVar4 = "errno = unknown";
    }
    std::operator<<(poVar7,pcVar4);
    pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar11,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/network.cc"
               ,0x33,&local_2e0);
    __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  iVar2 = socket(2,1,0);
  if (iVar2 == -1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&id);
    poVar7 = &local_2a0;
    std::operator<<(poVar7,"socket");
    piVar9 = __errno_location();
    pcVar4 = __errmsg;
    pcVar10 = strerror_r(*piVar9,pcVar4,0x100);
    if (pcVar10 == (char *)0x0) {
      poVar7 = std::operator<<(poVar7,"errno = ");
    }
    else {
      pcVar4 = "errno = unknown";
    }
    std::operator<<(poVar7,pcVar4);
    pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar11,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/network.cc"
               ,0x37,&local_300);
    __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  far_end.sin_family = 2;
  far_end.sin_port = uVar1 << 8 | uVar1 >> 8;
  far_end.sin_addr.s_addr = *(in_addr_t *)*phVar5->h_addr_list;
  far_end.sin_zero[0] = '\0';
  far_end.sin_zero[1] = '\0';
  far_end.sin_zero[2] = '\0';
  far_end.sin_zero[3] = '\0';
  far_end.sin_zero[4] = '\0';
  far_end.sin_zero[5] = '\0';
  far_end.sin_zero[6] = '\0';
  far_end.sin_zero[7] = '\0';
  iVar3 = connect(iVar2,(sockaddr *)&far_end,0x10);
  if (iVar3 != -1) {
    _id = (ostream *)((ulong)_id & 0xffffffffffffff00);
    sVar6 = write(iVar2,&id,1);
    if (sVar6 < 1) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"write failed!");
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    return iVar2;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&id);
  poVar7 = &local_2a0;
  poVar8 = std::operator<<(poVar7,"connect(");
  poVar8 = std::operator<<(poVar8,host);
  poVar8 = std::operator<<(poVar8,':');
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar1);
  std::operator<<(poVar8,")");
  piVar9 = __errno_location();
  pcVar4 = __errmsg;
  pcVar10 = strerror_r(*piVar9,pcVar4,0x100);
  if (pcVar10 == (char *)0x0) {
    poVar7 = std::operator<<(poVar7,"errno = ");
  }
  else {
    pcVar4 = "errno = unknown";
  }
  std::operator<<(poVar7,pcVar4);
  pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (pvVar11,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/network.cc"
             ,0x3f,&local_320);
  __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

int open_socket(const char* host)
{
#ifdef _WIN32
  const char* colon = strchr(host, ':');
#else
  const char* colon = index(host, ':');
#endif
  short unsigned int port = 26542;
  hostent* he;
  if (colon != nullptr)
  {
    port = atoi(colon + 1);
    string hostname(host, colon - host);
    he = gethostbyname(hostname.c_str());
  }
  else
    he = gethostbyname(host);

  if (he == nullptr)
    THROWERRNO("gethostbyname(" << host << ")");

  int sd = (int)socket(PF_INET, SOCK_STREAM, 0);
  if (sd == -1)
    THROWERRNO("socket");

  sockaddr_in far_end;
  far_end.sin_family = AF_INET;
  far_end.sin_port = htons(port);
  far_end.sin_addr = *(in_addr*)(he->h_addr);
  memset(&far_end.sin_zero, '\0', 8);
  if (connect(sd, (sockaddr*)&far_end, sizeof(far_end)) == -1)
    THROWERRNO("connect(" << host << ':' << port << ")");

  char id = '\0';
  if (
#ifdef _WIN32
      _write(sd, &id, sizeof(id)) < (int)sizeof(id)
#else
      write(sd, &id, sizeof(id)) < (int)sizeof(id)
#endif
  )
    cerr << "write failed!" << endl;
  return sd;
}